

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dws.cpp
# Opt level: O3

string * readLine_abi_cxx11_(string *__return_storage_ptr__,Stream *stream)

{
  undefined8 in_RAX;
  char c;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uStack_28 = in_RAX;
  do {
    (**(code **)(*(long *)stream + 0x20))(stream,(long)&uStack_28 + 7,1);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  } while (uStack_28._7_1_ != '\n');
  return __return_storage_ptr__;
}

Assistant:

string readLine(Stream* stream)
{
	char c;
	string line;
	do
	{
		stream->read(&c, 1);
		line += c;
	} while (c != '\n');
	return line;
}